

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::CurrentVertexAttribConversionCase::test
          (CurrentVertexAttribConversionCase *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float w_00;
  GLfloat w_3;
  GLfloat z_3;
  GLfloat y_3;
  GLfloat x_3;
  int index_3;
  GLfloat w_2;
  GLfloat z_2;
  GLfloat y_2;
  GLfloat x_2;
  int index_2;
  GLfloat w_1;
  GLfloat z_1;
  GLfloat y_1;
  GLfloat x_1;
  int index_1;
  GLfloat w;
  GLfloat z;
  GLfloat y;
  GLfloat x;
  int index;
  GLint local_24;
  undefined1 local_20 [4];
  int attribute_count;
  Random rnd;
  CurrentVertexAttribConversionCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_20,0xabcdef);
  local_24 = 0x10;
  glu::CallLogWrapper::glGetIntegerv(&(this->super_ApiCase).super_CallLogWrapper,0x8869,&local_24);
  for (y = 0.0; (int)y < local_24; y = (GLfloat)((int)y + 1)) {
    fVar1 = de::Random::getFloat((Random *)local_20,-64000.0,64000.0);
    fVar2 = de::Random::getFloat((Random *)local_20,-64000.0,64000.0);
    fVar3 = de::Random::getFloat((Random *)local_20,-64000.0,64000.0);
    w_00 = de::Random::getFloat((Random *)local_20,-64000.0,64000.0);
    glu::CallLogWrapper::glVertexAttrib4f
              (&(this->super_ApiCase).super_CallLogWrapper,(GLuint)y,fVar1,fVar2,fVar3,w_00);
    verifyCurrentVertexAttribConversion
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,(GLint)y,fVar1,fVar2,fVar3,w_00);
  }
  for (y_1 = 0.0; (int)y_1 < local_24; y_1 = (GLfloat)((int)y_1 + 1)) {
    fVar1 = de::Random::getFloat((Random *)local_20,-64000.0,64000.0);
    fVar2 = de::Random::getFloat((Random *)local_20,-64000.0,64000.0);
    fVar3 = de::Random::getFloat((Random *)local_20,-64000.0,64000.0);
    glu::CallLogWrapper::glVertexAttrib3f
              (&(this->super_ApiCase).super_CallLogWrapper,(GLuint)y_1,fVar1,fVar2,fVar3);
    verifyCurrentVertexAttribConversion
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,(GLint)y_1,fVar1,fVar2,fVar3,1.0);
  }
  for (y_2 = 0.0; (int)y_2 < local_24; y_2 = (GLfloat)((int)y_2 + 1)) {
    fVar1 = de::Random::getFloat((Random *)local_20,-64000.0,64000.0);
    fVar2 = de::Random::getFloat((Random *)local_20,-64000.0,64000.0);
    glu::CallLogWrapper::glVertexAttrib2f
              (&(this->super_ApiCase).super_CallLogWrapper,(GLuint)y_2,fVar1,fVar2);
    verifyCurrentVertexAttribConversion
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,(GLint)y_2,fVar1,fVar2,0.0,1.0);
  }
  for (y_3 = 0.0; (int)y_3 < local_24; y_3 = (GLfloat)((int)y_3 + 1)) {
    fVar1 = de::Random::getFloat((Random *)local_20,-64000.0,64000.0);
    glu::CallLogWrapper::glVertexAttrib1f
              (&(this->super_ApiCase).super_CallLogWrapper,(GLuint)y_3,fVar1);
    verifyCurrentVertexAttribConversion
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,(GLint)y_3,fVar1,0.0,0.0,1.0);
  }
  de::Random::~Random((Random *)local_20);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		de::Random rnd(0xabcdef);

		int attribute_count = 16;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &attribute_count);

		// test write float/read float

		for (int index = 0; index < attribute_count; ++index)
		{
			const GLfloat x = rnd.getFloat(-64000, 64000);
			const GLfloat y = rnd.getFloat(-64000, 64000);
			const GLfloat z = rnd.getFloat(-64000, 64000);
			const GLfloat w = rnd.getFloat(-64000, 64000);

			glVertexAttrib4f(index, x, y, z, w);
			verifyCurrentVertexAttribConversion(m_testCtx, *this, index, x, y, z, w);
		}
		for (int index = 0; index < attribute_count; ++index)
		{
			const GLfloat x = rnd.getFloat(-64000, 64000);
			const GLfloat y = rnd.getFloat(-64000, 64000);
			const GLfloat z = rnd.getFloat(-64000, 64000);
			const GLfloat w = 1.0f;

			glVertexAttrib3f(index, x, y, z);
			verifyCurrentVertexAttribConversion(m_testCtx, *this, index, x, y, z, w);
		}
		for (int index = 0; index < attribute_count; ++index)
		{
			const GLfloat x = rnd.getFloat(-64000, 64000);
			const GLfloat y = rnd.getFloat(-64000, 64000);
			const GLfloat z = 0.0f;
			const GLfloat w = 1.0f;

			glVertexAttrib2f(index, x, y);
			verifyCurrentVertexAttribConversion(m_testCtx, *this, index, x, y, z, w);
		}
		for (int index = 0; index < attribute_count; ++index)
		{
			const GLfloat x = rnd.getFloat(-64000, 64000);
			const GLfloat y = 0.0f;
			const GLfloat z = 0.0f;
			const GLfloat w = 1.0f;

			glVertexAttrib1f(index, x);
			verifyCurrentVertexAttribConversion(m_testCtx, *this, index, x, y, z, w);
		}
	}